

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3PagerSavepoint(Pager *pPager,int op,int iSavepoint)

{
  uint uVar1;
  u32 uVar2;
  Wal *pWVar3;
  PagerSavepoint *pPVar4;
  sqlite3_io_methods *psVar5;
  u32 *puVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  bool bVar11;
  u32 uVar12;
  u32 uVar13;
  int iVar14;
  uint uVar15;
  PgHdr *pPVar16;
  Pgno *pPVar17;
  long lVar18;
  i64 journalSize;
  uint uVar19;
  long lVar20;
  int iVar21;
  i64 *piVar22;
  bool bVar23;
  u32 dummy;
  Bitvec *local_50;
  ulong local_48;
  PagerSavepoint *local_40;
  u32 local_34;
  
  if (pPager->errCode != 0) {
    return pPager->errCode;
  }
  if (pPager->nSavepoint <= iSavepoint) {
    return 0;
  }
  iVar21 = (uint)(op != 1) + iSavepoint;
  if (iVar21 < pPager->nSavepoint) {
    lVar18 = (ulong)(op != 1) + (long)iSavepoint;
    lVar20 = lVar18 * 0x38 + 0x10;
    do {
      sqlite3BitvecDestroy(*(Bitvec **)((long)pPager->aSavepoint->aWalData + lVar20 + -0x24));
      lVar18 = lVar18 + 1;
      lVar20 = lVar20 + 0x38;
    } while (lVar18 < pPager->nSavepoint);
  }
  pPager->nSavepoint = iVar21;
  if (op == 1) {
    pPVar4 = pPager->aSavepoint;
    if (pPVar4[iVar21].bTruncateOnRelease == 0) {
      return 0;
    }
    psVar5 = pPager->sjfd->pMethods;
    iVar14 = 0;
    if (psVar5 == (sqlite3_io_methods *)0x0) {
      return 0;
    }
    if (psVar5 == &MemJournalMethods) {
      iVar14 = memjrnlTruncate(pPager->sjfd,(ulong)pPVar4[iVar21].iSubRec * (pPager->pageSize + 4));
    }
    pPager->nSubRec = pPVar4[iVar21].iSubRec;
    return iVar14;
  }
  pWVar3 = pPager->pWal;
  if ((pWVar3 == (Wal *)0x0) && (pPager->jfd->pMethods == (sqlite3_io_methods *)0x0)) {
    return 0;
  }
  if (iVar21 == 0) {
LAB_0012ea27:
    pPager->dbSize = pPager->dbOrigSize;
    pPager->changeCountDone = pPager->tempFile;
    if (pWVar3 != (Wal *)0x0) {
      if (pWVar3->writeLock == '\0') {
        iVar21 = 0;
      }
      else {
        uVar19 = (pWVar3->hdr).mxFrame;
        puVar6 = *pWVar3->apWiData;
        uVar12 = puVar6[0];
        uVar13 = puVar6[1];
        uVar7 = *(undefined8 *)(puVar6 + 2);
        uVar2 = puVar6[5];
        uVar8 = *(undefined8 *)(puVar6 + 6);
        uVar9 = *(undefined8 *)(puVar6 + 8);
        uVar10 = *(undefined8 *)(puVar6 + 10);
        (pWVar3->hdr).mxFrame = puVar6[4];
        (pWVar3->hdr).nPage = uVar2;
        *(undefined8 *)(pWVar3->hdr).aFrameCksum = uVar8;
        (pWVar3->hdr).iVersion = uVar12;
        (pWVar3->hdr).unused = uVar13;
        (pWVar3->hdr).iChange = (int)uVar7;
        (pWVar3->hdr).isInit = (char)((ulong)uVar7 >> 0x20);
        (pWVar3->hdr).bigEndCksum = (char)((ulong)uVar7 >> 0x28);
        (pWVar3->hdr).szPage = (short)((ulong)uVar7 >> 0x30);
        *(undefined8 *)(pWVar3->hdr).aSalt = uVar9;
        *(undefined8 *)(pWVar3->hdr).aCksum = uVar10;
        uVar15 = (pWVar3->hdr).mxFrame;
        iVar21 = 0;
        if (uVar15 + 1 <= uVar19) {
          uVar15 = uVar15 + 0x1001;
          do {
            if (((ulong)uVar15 + 0xffffffff021 & 0xffffffff000) == 0) {
              pPVar17 = *pWVar3->apWiData + (ulong)(uVar15 - 0x1000) + 0x21;
            }
            else {
              pPVar17 = (Pgno *)((ulong)((uVar15 - 0xfdf & 0xfff) << 2) +
                                (long)pWVar3->apWiData[(int)((ulong)uVar15 + 0xffffffff021 >> 0xc)])
              ;
            }
            iVar21 = pagerUndoCallback(pPager,*pPVar17);
          } while ((iVar21 == 0) && (uVar1 = uVar15 - 0xfff, uVar15 = uVar15 + 1, uVar1 <= uVar19));
          uVar15 = (pWVar3->hdr).mxFrame;
        }
        if (uVar19 != uVar15) {
          walCleanupHash(pWVar3);
        }
      }
      pPVar16 = sqlite3PcacheDirtyList(pPager->pPCache);
      if (iVar21 != 0 || pPVar16 == (PgHdr *)0x0) {
        return iVar21;
      }
      do {
        pPVar17 = &pPVar16->pgno;
        pPVar16 = pPVar16->pDirty;
        iVar21 = pagerUndoCallback(pPager,*pPVar17);
        if (pPVar16 == (PgHdr *)0x0) {
          return iVar21;
        }
      } while (iVar21 == 0);
      return iVar21;
    }
    journalSize = pPager->journalOff;
    bVar11 = true;
    local_40 = (PagerSavepoint *)0x0;
    local_50 = (Bitvec *)0x0;
LAB_0012eb31:
    pPager->journalOff = 0;
LAB_0012eb38:
    do {
      piVar22 = &pPager->journalOff;
      if (journalSize <= *piVar22) {
        iVar21 = 0;
        break;
      }
      local_48 = local_48 & 0xffffffff00000000;
      iVar21 = readJournalHdr(pPager,0,journalSize,(u32 *)&local_48,&local_34);
      uVar19 = (uint)local_48;
      if ((uint)local_48 == 0) {
        lVar18 = (ulong)pPager->sectorSize + pPager->journalHdr;
        if (lVar18 == pPager->journalOff) {
          uVar19 = (uint)((journalSize - lVar18) / (pPager->pageSize + 8));
          goto LAB_0012eb95;
        }
      }
      else {
LAB_0012eb95:
        if ((iVar21 == 0) && (uVar19 != 0)) {
          uVar15 = 1;
          while (*piVar22 < journalSize) {
            iVar21 = pager_playback_one_page(pPager,piVar22,local_50,1,1);
            if ((iVar21 != 0) || (bVar23 = uVar19 <= uVar15, uVar15 = uVar15 + 1, bVar23))
            goto LAB_0012ebda;
          }
          iVar21 = 0;
        }
      }
LAB_0012ebda:
    } while (iVar21 == 0);
    if (bVar11) goto LAB_0012ece5;
  }
  else {
    pPVar4 = pPager->aSavepoint;
    local_40 = pPVar4 + (long)iVar21 + -1;
    if (local_40 == (PagerSavepoint *)0x0) goto LAB_0012ea27;
    uVar2 = pPVar4[(long)iVar21 + -1].nOrig;
    local_50 = (Bitvec *)sqlite3Malloc(0x200);
    if (local_50 == (Bitvec *)0x0) {
      return 7;
    }
    bVar11 = false;
    memset(&local_50->nSet,0,0x1fc);
    local_50->iSize = uVar2;
    pPager->dbSize = pPVar4[(long)iVar21 + -1].nOrig;
    pPager->changeCountDone = pPager->tempFile;
    piVar22 = &pPager->journalOff;
    journalSize = pPager->journalOff;
    if (pPager->pWal != (Wal *)0x0) goto LAB_0012eb31;
    lVar18 = pPVar4[(long)iVar21 + -1].iHdrOffset;
    if (pPVar4[(long)iVar21 + -1].iHdrOffset == 0) {
      lVar18 = journalSize;
    }
    *piVar22 = pPVar4[(long)iVar21 + -1].iOffset;
    do {
      if (lVar18 <= *piVar22) {
        bVar11 = false;
        goto LAB_0012eb38;
      }
      iVar21 = pager_playback_one_page(pPager,piVar22,local_50,1,1);
    } while (iVar21 == 0);
  }
  pPVar4 = local_40;
  uVar19 = local_40->iSubRec;
  local_48 = (pPager->pageSize + 4) * (ulong)uVar19;
  pWVar3 = pPager->pWal;
  if (pWVar3 == (Wal *)0x0) {
    if (iVar21 != 0) goto LAB_0012ece5;
  }
  else {
    if (local_40->aWalData[3] == pWVar3->nCkpt) {
      uVar15 = local_40->aWalData[0];
    }
    else {
      local_40->aWalData[0] = 0;
      local_40->aWalData[3] = pWVar3->nCkpt;
      uVar15 = 0;
    }
    if (uVar15 < (pWVar3->hdr).mxFrame) {
      (pWVar3->hdr).mxFrame = uVar15;
      (pWVar3->hdr).aFrameCksum[0] = local_40->aWalData[1];
      (pWVar3->hdr).aFrameCksum[1] = local_40->aWalData[2];
      walCleanupHash(pWVar3);
      uVar19 = pPVar4->iSubRec;
    }
  }
  uVar19 = uVar19 - 1;
  do {
    uVar19 = uVar19 + 1;
    iVar21 = 0;
    if (pPager->nSubRec <= uVar19) break;
    iVar21 = pager_playback_one_page(pPager,(i64 *)&local_48,local_50,0,1);
  } while (iVar21 == 0);
LAB_0012ece5:
  sqlite3BitvecDestroy(local_50);
  if (iVar21 == 0) {
    pPager->journalOff = journalSize;
    iVar21 = 0;
  }
  return iVar21;
}

Assistant:

SQLITE_PRIVATE int sqlite3PagerSavepoint(Pager *pPager, int op, int iSavepoint){
  int rc = pPager->errCode;

#ifdef SQLITE_ENABLE_ZIPVFS
  if( op==SAVEPOINT_RELEASE ) rc = SQLITE_OK;
#endif

  assert( op==SAVEPOINT_RELEASE || op==SAVEPOINT_ROLLBACK );
  assert( iSavepoint>=0 || op==SAVEPOINT_ROLLBACK );

  if( rc==SQLITE_OK && iSavepoint<pPager->nSavepoint ){
    int ii;            /* Iterator variable */
    int nNew;          /* Number of remaining savepoints after this op. */

    /* Figure out how many savepoints will still be active after this
    ** operation. Store this value in nNew. Then free resources associated
    ** with any savepoints that are destroyed by this operation.
    */
    nNew = iSavepoint + (( op==SAVEPOINT_RELEASE ) ? 0 : 1);
    for(ii=nNew; ii<pPager->nSavepoint; ii++){
      sqlite3BitvecDestroy(pPager->aSavepoint[ii].pInSavepoint);
    }
    pPager->nSavepoint = nNew;

    /* Truncate the sub-journal so that it only includes the parts
    ** that are still in use. */
    if( op==SAVEPOINT_RELEASE ){
      PagerSavepoint *pRel = &pPager->aSavepoint[nNew];
      if( pRel->bTruncateOnRelease && isOpen(pPager->sjfd) ){
        /* Only truncate if it is an in-memory sub-journal. */
        if( sqlite3JournalIsInMemory(pPager->sjfd) ){
          i64 sz = (pPager->pageSize+4)*(i64)pRel->iSubRec;
          rc = sqlite3OsTruncate(pPager->sjfd, sz);
          assert( rc==SQLITE_OK );
        }
        pPager->nSubRec = pRel->iSubRec;
      }
    }
    /* Else this is a rollback operation, playback the specified savepoint.
    ** If this is a temp-file, it is possible that the journal file has
    ** not yet been opened. In this case there have been no changes to
    ** the database file, so the playback operation can be skipped.
    */
    else if( pagerUseWal(pPager) || isOpen(pPager->jfd) ){
      PagerSavepoint *pSavepoint = (nNew==0)?0:&pPager->aSavepoint[nNew-1];
      rc = pagerPlaybackSavepoint(pPager, pSavepoint);
      assert(rc!=SQLITE_DONE);
    }

#ifdef SQLITE_ENABLE_ZIPVFS
    /* If the cache has been modified but the savepoint cannot be rolled
    ** back journal_mode=off, put the pager in the error state. This way,
    ** if the VFS used by this pager includes ZipVFS, the entire transaction
    ** can be rolled back at the ZipVFS level.  */
    else if(
        pPager->journalMode==PAGER_JOURNALMODE_OFF
     && pPager->eState>=PAGER_WRITER_CACHEMOD
    ){
      pPager->errCode = SQLITE_ABORT;
      pPager->eState = PAGER_ERROR;
      setGetterMethod(pPager);
    }
#endif
  }

  return rc;
}